

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O0

void __thiscall
NoMeEdgeCalculator::NoMeEdgeCalculator
          (NoMeEdgeCalculator *this,double nomeParam,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *switchRateFS,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *switchRateRS)

{
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_RDX;
  EdgeCalculator *in_RDI;
  _func_int **in_XMM0_Qa;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_00;
  
  EdgeCalculator::EdgeCalculator(in_RDI);
  in_RDI->_vptr_EdgeCalculator = (_func_int **)&PTR__NoMeEdgeCalculator_00352e10;
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x26895e);
  this_00 = (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             *)(in_RDI + 9);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x268971);
  in_RDI[1]._vptr_EdgeCalculator = in_XMM0_Qa;
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=(this_00,in_RDX);
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=(this_00,in_RDX);
  return;
}

Assistant:

NoMeEdgeCalculator::NoMeEdgeCalculator(double nomeParam, std::unordered_map<int, double> switchRateFS, std::unordered_map<int, double> switchRateRS) {
    this->nomeParam = nomeParam;
    this->switchRateFS = switchRateFS;
    this->switchRateRS = switchRateRS;
 }